

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test::TestBody
          (DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test *this)

{
  bool bVar1;
  AssertHelper local_90;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_buf_optimal_sz = 500;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.rc_buf_sz =
       1000;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_buf_initial_sz = 500;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_end_usage = AOM_CBR;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_target_bitrate = 200;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_min_quantizer = 0;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_max_quantizer = 0x32;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_undershoot_pct = 0x14;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  g_lag_in_frames = 0;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  rc_dropframe_thresh = 0;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.
  g_error_resilient = 1;
  (this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.cfg_.kf_max_dist
       = 9999;
  (this->super_DatarateTestSetFrameQpRealtime).total_frames_ = 100;
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_90);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,0x1e,1,0,100);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  (*(this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.
    _vptr_EncoderTest[0x13])(this);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTestSetFrameQpRealtime).super_DatarateTest.super_EncoderTest.
        _vptr_EncoderTest[2])(this,&video);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (gtest_fatal_failure_checker.has_new_fatal_failure_ == false) goto LAB_0058a585;
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
             ,0x2f7,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_0058a585:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(DatarateTestSetFrameQpRealtime, SetFrameQpOnePass) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.rc_undershoot_pct = 20;
  cfg_.rc_undershoot_pct = 20;
  cfg_.rc_min_quantizer = 0;
  cfg_.rc_max_quantizer = 50;
  cfg_.rc_end_usage = AOM_CBR;
  cfg_.rc_target_bitrate = 200;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 1;
  cfg_.kf_max_dist = 9999;
  cfg_.rc_dropframe_thresh = 0;

  total_frames_ = 100;
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 100);

  ResetModel();
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}